

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O2

void __thiscall dg::debug::LLVMDGDumpBlocks::dumpBlock(LLVMDGDumpBlocks *this,LLVMBBlock *blk)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  ofstream *poVar4;
  uint uVar5;
  char *pcVar6;
  char cVar7;
  string str;
  raw_os_ostream ro;
  ostringstream ostr;
  long local_200 [4];
  code *local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  ostringstream *local_1a0;
  ostringstream local_198 [376];
  
  poVar4 = &(this->super_DG2Dot<dg::LLVMNode>).out;
  poVar1 = std::operator<<((ostream *)poVar4,"NODE");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1," [label=\"");
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1d8 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = 1;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  local_1e0 = std::__throw_length_error;
  local_1a0 = local_198;
  llvm::operator<<((raw_ostream *)&local_1e0,blk->key);
  llvm::raw_ostream::flush((raw_ostream *)&local_1e0);
  std::__cxx11::stringbuf::str();
  uVar5 = 0;
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    cVar7 = *(char *)(local_200[0] + uVar3);
    if (cVar7 == '\0') break;
    if (uVar5 < 0x28) {
      uVar5 = uVar5 + 1;
    }
    else {
      *(undefined1 *)(local_200[0] + uVar3) = 10;
      cVar7 = *(char *)(local_200[0] + uVar3);
      uVar5 = 0;
    }
    if (cVar7 == '\n') {
      uVar5 = 0;
    }
    uVar2 = uVar2 + 1;
  }
  if ((int)blk->slice_id == 0) {
    poVar1 = std::operator<<((ostream *)poVar4,(string *)local_200);
    pcVar6 = "\"";
  }
  else {
    poVar1 = std::operator<<((ostream *)poVar4,"\\nslice: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"\\n");
    poVar1 = std::operator<<((ostream *)poVar4,(string *)local_200);
    std::operator<<(poVar1,"\"");
    pcVar6 = "style=filled fillcolor=greenyellow";
    poVar1 = (ostream *)poVar4;
  }
  std::operator<<(poVar1,pcVar6);
  std::operator<<((ostream *)poVar4,"]\n");
  std::__cxx11::string::_M_dispose();
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void dumpBlock(LLVMBBlock *blk) {
        out << "NODE" << blk << " [label=\"";

        std::ostringstream ostr;
        llvm::raw_os_ostream ro(ostr);

        ro << *blk->getKey();
        ro.flush();
        std::string str = ostr.str();

        unsigned int i = 0;
        unsigned int len = 0;
        while (str[i] != 0) {
            if (len >= 40) {
                str[i] = '\n';
                len = 0;
            } else
                ++len;

            if (str[i] == '\n')
                len = 0;

            ++i;
        }

        unsigned int slice_id = blk->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id << "\\n";
        out << str << "\"";

        if (slice_id != 0)
            out << "style=filled fillcolor=greenyellow";

        out << "]\n";
    }